

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

ConstantValue *
slang::ast::Bitstream::convertToBitVector
          (ConstantValue *value,SourceRange sourceRange,EvalContext *context)

{
  bool bVar1;
  ConstantValue *in_RDI;
  ConstantValue *in_stack_00000038;
  Type *type;
  uint64_t width;
  bool in_stack_00000077;
  EvalContext *in_stack_00000078;
  ConstantValue *in_stack_00000080;
  Type *in_stack_00000088;
  undefined1 in_stack_00000090 [16];
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ConstantValue *in_stack_ffffffffffffff90;
  
  bVar1 = slang::ConstantValue::bad((ConstantValue *)0xa20044);
  if ((!bVar1) && (bVar1 = slang::ConstantValue::isInteger((ConstantValue *)0xa20052), !bVar1)) {
    slang::ConstantValue::getBitstreamWidth(in_stack_00000038);
    EvalContext::getCompilation((EvalContext *)0xa20085);
    ast::operator|(TwoState,TwoState);
    Compilation::getType
              ((Compilation *)value,context._4_4_,
               (bitmask<slang::ast::IntegralFlags>)sourceRange.startLoc._7_1_);
    evaluateCast(in_stack_00000088,in_stack_00000080,(SourceRange)in_stack_00000090,
                 in_stack_00000078,in_stack_00000077);
    return in_RDI;
  }
  slang::ConstantValue::ConstantValue
            (in_stack_ffffffffffffff90,
             (ConstantValue *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  return in_RDI;
}

Assistant:

ConstantValue Bitstream::convertToBitVector(ConstantValue&& value, SourceRange sourceRange,
                                            EvalContext& context) {
    if (value.bad() || value.isInteger())
        return value;

    // We don't worry about width being too large for an integral type here because we limit
    // how large any constant value can be.
    const uint64_t width = value.getBitstreamWidth();
    auto& type = context.getCompilation().getType(bitwidth_t(width), IntegralFlags::FourState |
                                                                         IntegralFlags::Unsigned);

    return evaluateCast(type, std::move(value), sourceRange, context, /* isImplicit */ true);
}